

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void hurtle(int dx,int dy,int range,boolean verbose)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_38;
  char *local_30;
  char *local_28;
  coord local_19;
  coord local_17;
  boolean local_15;
  undefined1 auStack_14 [3];
  coord cc;
  coord uc;
  boolean verbose_local;
  int range_local;
  int dy_local;
  int dx_local;
  
  local_15 = verbose;
  _auStack_14 = range;
  unique0x10000228 = dy;
  if ((uball == (obj *)0x0) || (uball->where == '\x03')) {
    if (u.utrap == 0) {
      iVar1 = sgn(dx);
      register0x00000000 = sgn(stack0xfffffffffffffff0);
      if ((_auStack_14 != 0) &&
         (((iVar1 != 0 || (register0x00000000 != 0)) && (u.ustuck == (monst *)0x0)))) {
        nomul(-_auStack_14,"moving through the air");
        if (local_15 != '\0') {
          pcVar3 = "float";
          if (1 < _auStack_14) {
            pcVar3 = "hurtle";
          }
          pline("You %s in the opposite direction.",pcVar3);
        }
        if (m_shot.i < m_shot.n) {
          pcVar3 = "throw";
          if (m_shot.s != '\0') {
            pcVar3 = "shoot";
          }
          pcVar2 = "toss";
          if (m_shot.s != '\0') {
            pcVar2 = "shot";
          }
          pline("You stop %sing after the first %s.",pcVar3,pcVar2);
          m_shot.n = m_shot.i;
        }
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          sokoban_trickster();
        }
        local_17.x = u.ux;
        local_17.y = u.uy;
        local_19.x = u.ux + (char)iVar1 * (char)_auStack_14;
        local_19.y = u.uy + (char)stack0xfffffffffffffff0 * (char)_auStack_14;
        walk_path(&local_17,&local_19,hurtle_step,auStack_14);
      }
    }
    else {
      if (u.utraptype == 2) {
        local_28 = "web";
      }
      else {
        if (u.utraptype == 3) {
          local_30 = "lava";
        }
        else {
          if (u.utraptype == 4) {
            local_38 = surface((int)u.ux,(int)u.uy);
          }
          else {
            local_38 = "trap";
          }
          local_30 = local_38;
        }
        local_28 = local_30;
      }
      pline("You are anchored by the %s.",local_28);
      nomul(0,(char *)0x0);
    }
  }
  else {
    pline("You feel a tug from the iron ball.");
    nomul(0,(char *)0x0);
  }
  return;
}

Assistant:

void hurtle(int dx, int dy, int range, boolean verbose)
{
    coord uc, cc;

    /* The chain is stretched vertically, so you shouldn't be able to move
     * very far diagonally.  The premise that you should be able to move one
     * spot leads to calculations that allow you to only move one spot away
     * from the ball, if you are levitating over the ball, or one spot
     * towards the ball, if you are at the end of the chain.  Rather than
     * bother with all of that, assume that there is no slack in the chain
     * for diagonal movement, give the player a message and return.
     */
    if (Punished && !carried(uball)) {
	pline("You feel a tug from the iron ball.");
	nomul(0, NULL);
	return;
    } else if (u.utrap) {
	pline("You are anchored by the %s.",
	    u.utraptype == TT_WEB ? "web" : u.utraptype == TT_LAVA ? "lava" :
		u.utraptype == TT_INFLOOR ? surface(u.ux,u.uy) : "trap");
	nomul(0, NULL);
	return;
    }

    /* make sure dx and dy are [-1,0,1] */
    dx = sgn(dx);
    dy = sgn(dy);

    if (!range || (!dx && !dy) || u.ustuck) return; /* paranoia */

    nomul(-range, "moving through the air");
    if (verbose)
	pline("You %s in the opposite direction.", range > 1 ? "hurtle" : "float");
    /* if we're in the midst of shooting multiple projectiles, stop */
    if (m_shot.i < m_shot.n) {
	/* last message before hurtling was "you shoot N arrows" */
	pline("You stop %sing after the first %s.",
	    m_shot.s ? "shoot" : "throw", m_shot.s ? "shot" : "toss");
	m_shot.n = m_shot.i;	/* make current shot be the last */
    }
    if (In_sokoban(&u.uz))
	sokoban_trickster();	/* Sokoban guilt */
    uc.x = u.ux;
    uc.y = u.uy;
    /* this setting of cc is only correct if dx and dy are [-1,0,1] only */
    cc.x = u.ux + (dx * range);
    cc.y = u.uy + (dy * range);
    walk_path(&uc, &cc, hurtle_step, &range);
}